

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

int __thiscall Style::Entry::copy(Entry *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Constraints local_80;
  undefined1 local_19;
  EVP_PKEY_CTX *local_18;
  Entry *this_local;
  Entry *copy;
  
  local_19 = 0;
  local_18 = dst;
  this_local = this;
  Entry(this,(u16string *)dst,(bool)((byte)dst[0x58] & 1));
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::vector(&local_80.all,
           (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            *)(dst + 0x60));
  std::
  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
  ::vector(&local_80.some,
           (vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
            *)(dst + 0x78));
  std::
  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
  ::vector(&local_80.one,
           (vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
            *)(dst + 0x90));
  std::vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_>::vector
            (&local_80.conditional,
             (vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_> *)
             (dst + 0xa8));
  Constraints::operator=(&this->constraints,&local_80);
  Constraints::~Constraints(&local_80);
  std::
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
  ::operator=(&this->fields,
              (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
               *)(dst + 0x20));
  return (int)this;
}

Assistant:

Entry Entry::copy () {
    Entry copy { name, skipOut };

    copy.constraints = Entry::Constraints {
        constraints.all,
        constraints.some,
        constraints.one,
        constraints.conditional // TODO: Copy conditional constraints properly
    };

    copy.fields = fields;

    return copy;
}